

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O1

void custom_background(bool status,int color)

{
  long lVar1;
  uint uVar2;
  long *plVar3;
  uint uVar4;
  long *plVar5;
  ulong uVar6;
  uint __val;
  undefined7 in_register_00000039;
  uint __len;
  long *local_88;
  long local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if ((int)CONCAT71(in_register_00000039,status) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[48;5;0m",9);
    return;
  }
  __val = -color;
  if (0 < color) {
    __val = color;
  }
  __len = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar4 = (uint)uVar6;
      if (uVar4 < 100) {
        __len = __len - 2;
        goto LAB_00112907;
      }
      if (uVar4 < 1000) {
        __len = __len - 1;
        goto LAB_00112907;
      }
      if (uVar4 < 10000) goto LAB_00112907;
      uVar6 = uVar6 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar4);
    __len = __len + 1;
  }
LAB_00112907:
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,(char)__len - (char)(color >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_48[0] + ((uint)color >> 0x1f),__len,__val);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x115a03);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_58 = *plVar5;
    lStack_50 = plVar3[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar5;
    local_68 = (long *)*plVar3;
  }
  local_60 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_78 = *plVar5;
    lStack_70 = plVar3[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar5;
    local_88 = (long *)*plVar3;
  }
  lVar1 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)local_88,lVar1);
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return;
}

Assistant:

void custom_background(bool status,int color){
	if (status == true) cout<<"\033[48;5;"+to_string(color)+"m";
	else cout<<"\033[48;5;0m";
}